

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IsPartOfPdu.cpp
# Opt level: O1

void __thiscall DIS::IsPartOfPdu::marshal(IsPartOfPdu *this,DataStream *dataStream)

{
  EntityManagementFamilyPdu::marshal(&this->super_EntityManagementFamilyPdu,dataStream);
  EntityID::marshal(&this->_orginatingEntityID,dataStream);
  EntityID::marshal(&this->_receivingEntityID,dataStream);
  Relationship::marshal(&this->_relationship,dataStream);
  Vector3Float::marshal(&this->_partLocation,dataStream);
  NamedLocationIdentification::marshal(&this->_namedLocationID,dataStream);
  EntityType::marshal(&this->_partEntityType,dataStream);
  return;
}

Assistant:

void IsPartOfPdu::marshal(DataStream& dataStream) const
{
    EntityManagementFamilyPdu::marshal(dataStream); // Marshal information in superclass first
    _orginatingEntityID.marshal(dataStream);
    _receivingEntityID.marshal(dataStream);
    _relationship.marshal(dataStream);
    _partLocation.marshal(dataStream);
    _namedLocationID.marshal(dataStream);
    _partEntityType.marshal(dataStream);
}